

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  short sVar1;
  ushort uVar2;
  uint *puVar3;
  short sVar4;
  int iVar5;
  int *piVar6;
  short *psVar7;
  undefined8 uVar8;
  void *pvVar9;
  char *fmt;
  long request;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  long local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar3 = (uint *)a->format->data;
  if (puVar3[0x13d4] == 0xffffffff) {
    puVar3[0x13d4] = 0;
  }
  piVar6 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar6 == (int *)0x0) {
    iVar5 = 1;
  }
  else {
    if ((puVar3[0x3e] != 0) ||
       ((((char)*piVar6 != 'M' || (*(char *)((long)piVar6 + 1) != 'Z')) && (*piVar6 != 0x464c457f)))
       ) {
LAB_00125238:
      puVar3[0x3e] = 1;
LAB_0012524f:
      uVar12 = 7;
      psVar7 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (psVar7 == (short *)0x0) goto LAB_00125564;
      sVar4 = psVar7[1];
      switch((char)sVar4) {
      case 'r':
        iVar5 = bcmp(psVar7,"Rar!\x1a\a",7);
        if (iVar5 != 0) {
          fmt = "Invalid marker header";
          goto LAB_00125557;
        }
        break;
      case 's':
        *puVar3 = (uint)*(ushort *)((long)psVar7 + 3);
        uVar2 = *(ushort *)((long)psVar7 + 5);
        uVar12 = (ulong)uVar2;
        if (uVar12 < 0xd) {
LAB_00125501:
          fmt = "Invalid header size";
          goto LAB_00125557;
        }
        psVar7 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
        if (psVar7 == (short *)0x0) goto LAB_00125564;
        *(undefined2 *)(puVar3 + 4) = *(undefined2 *)((long)psVar7 + 7);
        *(undefined4 *)((long)puVar3 + 0x12) = *(undefined4 *)((long)psVar7 + 9);
        if ((*puVar3 >> 9 & 1) != 0) {
          if (uVar2 == 0xd) goto LAB_00125501;
          *(undefined1 *)((long)puVar3 + 0x16) = *(undefined1 *)((long)psVar7 + 0xd);
        }
        if ((char)*puVar3 < '\0') {
          archive_entry_set_is_metadata_encrypted(entry,'\x01');
          archive_entry_set_is_data_encrypted(entry,'\x01');
          puVar3[0x13d4] = 1;
          fmt = "RAR encryption support unavailable.";
          goto LAB_00125557;
        }
        sVar4 = crc32(0,psVar7 + 1,uVar2 - 2);
        if (*psVar7 != sVar4) goto LAB_001254f4;
        break;
      case 't':
        iVar5 = read_header(a,entry,'t');
        return iVar5;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar12 = (ulong)*(ushort *)((long)psVar7 + 5);
        if (uVar12 < 7) {
LAB_001254d2:
          fmt = "Invalid header size too small";
          goto LAB_00125557;
        }
        if (*(short *)((long)psVar7 + 3) < 0) {
          if (*(ushort *)((long)psVar7 + 5) < 0xb) goto LAB_001254d2;
          psVar7 = (short *)__archive_read_ahead(a,uVar12,(ssize_t *)0x0);
          if (psVar7 == (short *)0x0) goto LAB_00125564;
          uVar12 = uVar12 + *(uint *)((long)psVar7 + 7);
        }
        sVar1 = *psVar7;
        __archive_read_consume(a,2);
        uVar8 = 0;
        for (uVar12 = uVar12 - 2; uVar12 != 0; uVar12 = uVar12 - uVar10) {
          uVar10 = 0x8000;
          if (uVar12 < 0x8000) {
            uVar10 = uVar12;
          }
          pvVar9 = __archive_read_ahead(a,uVar10,(ssize_t *)0x0);
          if (pvVar9 == (void *)0x0) goto switchD_0012527f_default;
          uVar8 = crc32(uVar8,pvVar9,uVar10 & 0xffffffff);
          __archive_read_consume(a,uVar10);
        }
        if (sVar1 != (short)uVar8) {
LAB_001254f4:
          fmt = "Header CRC error";
          goto LAB_00125557;
        }
        if ((char)sVar4 == '{') {
          return 1;
        }
        goto LAB_0012524f;
      case 'z':
        goto switchD_0012527f_caseD_7a;
      default:
switchD_0012527f_default:
        fmt = "Bad RAR file";
        goto LAB_00125557;
      }
      __archive_read_consume(a,uVar12);
      goto LAB_0012524f;
    }
    uVar12 = 0x1000;
    lVar11 = 0;
    while( true ) {
      while( true ) {
        if (0x20000 < lVar11 + uVar12) goto LAB_001254c6;
        pvVar9 = __archive_read_ahead(a,uVar12,&local_38);
        if (pvVar9 != (void *)0x0) break;
        bVar13 = uVar12 < 0x80;
        uVar12 = uVar12 >> 1;
        if (bVar13) goto LAB_001254c6;
      }
      if (local_38 < 0x40) break;
      uVar10 = local_38 + (long)pvVar9;
      for (request = 0; (ulong)((long)pvVar9 + request + 7) < uVar10; request = request + 0x10) {
        iVar5 = bcmp((void *)((long)pvVar9 + request),"Rar!\x1a\a",7);
        if (iVar5 == 0) {
          __archive_read_consume(a,request);
          goto LAB_00125238;
        }
      }
      __archive_read_consume(a,request);
      lVar11 = lVar11 + request;
    }
LAB_001254c6:
    fmt = "Couldn\'t find out RAR header";
LAB_00125557:
    archive_set_error(&a->archive,0x54,fmt);
LAB_00125564:
    iVar5 = -0x1e;
  }
  return iVar5;
switchD_0012527f_caseD_7a:
  iVar5 = read_header(a,entry,'z');
  if (iVar5 < -0x14) {
    return iVar5;
  }
  goto LAB_0012524f;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;
  unsigned long crc32_expected;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrypted, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size too small");
        return (ARCHIVE_FATAL);
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size too small");
          return (ARCHIVE_FATAL);
        }
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
        skip += archive_le32dec(p + 7);
      }

      /* Skip over the 2-byte CRC at the beginning of the header. */
      crc32_expected = archive_le16dec(p);
      __archive_read_consume(a, 2);
      skip -= 2;

      /* Skim the entire header and compute the CRC. */
      crc32_val = 0;
      while (skip > 0) {
	      size_t to_read = skip;
	      if (to_read > 32 * 1024)
		      to_read = 32 * 1024;
	      if ((h = __archive_read_ahead(a, to_read, NULL)) == NULL) {
		      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
			  "Bad RAR file");
		      return (ARCHIVE_FATAL);
	      }
	      p = h;
	      crc32_val = crc32(crc32_val, (const unsigned char *)p, (unsigned int)to_read);
	      __archive_read_consume(a, to_read);
	      skip -= to_read;
      }
      if ((crc32_val & 0xffff) != crc32_expected) {
#ifndef DONT_FAIL_ON_CRC_ERROR
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		  "Header CRC error");
	      return (ARCHIVE_FATAL);
#endif
      }
      if (head_type == ENDARC_HEAD)
	      return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}